

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int is_valid_day(int year,int month,int day)

{
  int day_local;
  int month_local;
  int year_local;
  
  if (day < 1) {
    return 0;
  }
  if (month != 1) {
    if (month == 2) {
      if (((year % 4 != 0) || (year % 100 == 0)) && (year % 400 != 0)) {
        return (uint)(day < 0x1d);
      }
      return (uint)(day < 0x1e);
    }
    if (month != 3) {
      if (month == 4) {
LAB_001e7f98:
        return (uint)(day < 0x1f);
      }
      if (month != 5) {
        if (month == 6) goto LAB_001e7f98;
        if (1 < month - 7U) {
          if (month == 9) goto LAB_001e7f98;
          if (month != 10) {
            if (month == 0xb) goto LAB_001e7f98;
            if (month != 0xc) {
              return 0;
            }
          }
        }
      }
    }
  }
  return (uint)(day < 0x20);
}

Assistant:

static int is_valid_day(int year, int month, int day) {
  if (day < 1) {
    return 0;
  }
  switch (month) {
    case 1:
    case 3:
    case 5:
    case 7:
    case 8:
    case 10:
    case 12:
      return day <= 31;
    case 4:
    case 6:
    case 9:
    case 11:
      return day <= 30;
    case 2:
      if ((year % 4 == 0 && year % 100 != 0) || year % 400 == 0) {
        return day <= 29;
      } else {
        return day <= 28;
      }
    default:
      return 0;
  }
}